

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_already_open(fitsfile **fptr,char *url,char *urltype,char *infile,char *extspec,
                     char *rowfilter,char *binspec,char *colspec,int mode,int noextsyn,int *isopen,
                     int *status)

{
  int *piVar1;
  FITSfile *pFVar2;
  char *__s;
  int iVar3;
  size_t sVar4;
  fitsfile *pfVar5;
  FITSfile **ppFVar6;
  uint uVar7;
  long lVar8;
  uint local_1cd4;
  char oldurltype [20];
  char tmpinfile [1025];
  char oldinfile [1025];
  char oldcolspec [1025];
  char oldbinspec [1025];
  char oldrowfilter [1025];
  char oldextspec [1025];
  char oldoutfile [1025];
  
  *isopen = 0;
  if (mode != 0) {
    strcpy(tmpinfile,infile);
    iVar3 = fits_strcasecmp(urltype,"FILE://");
    if ((iVar3 != 0) || (iVar3 = standardize_path(tmpinfile,status), iVar3 == 0)) {
      local_1cd4 = 0xffffffff;
      ppFVar6 = FptrTable;
      for (lVar8 = 0; lVar8 != 10000; lVar8 = lVar8 + 1) {
        pFVar2 = *ppFVar6;
        if (pFVar2 != (FITSfile *)0x0) {
          uVar7 = (uint)lVar8;
          if (pFVar2->noextsyntax == 0) {
            ffiurl(pFVar2->filename,oldurltype,oldinfile,oldoutfile,oldextspec,oldrowfilter,
                   oldbinspec,oldcolspec,status);
            if (0 < *status) {
              ffpmsg("could not parse the previously opened filename: (ffopen)");
              ffpmsg(pFVar2->filename);
              goto LAB_001128da;
            }
            iVar3 = fits_strcasecmp(oldurltype,"FILE://");
            if ((iVar3 == 0) && (iVar3 = standardize_path(oldinfile,status), iVar3 != 0))
            goto LAB_001128da;
            iVar3 = strcmp(urltype,oldurltype);
            if ((iVar3 == 0) && (iVar3 = strcmp(tmpinfile,oldinfile), iVar3 == 0)) {
              if (((oldrowfilter[0] == '\0' && *rowfilter == '\0') &&
                  (oldbinspec[0] == '\0' && *binspec == '\0')) &&
                 (oldcolspec[0] == '\0' && *colspec == '\0')) goto joined_r0x001127be;
              iVar3 = strcmp(rowfilter,oldrowfilter);
              if (((iVar3 == 0) && (iVar3 = strcmp(binspec,oldbinspec), iVar3 == 0)) &&
                 (iVar3 = strcmp(colspec,oldcolspec), iVar3 == 0)) {
                iVar3 = strcmp(extspec,oldextspec);
                if (iVar3 == 0) {
                  local_1cd4 = uVar7;
                }
                if (iVar3 == 0 && mode == 1) goto LAB_00112618;
              }
            }
          }
          else {
            iVar3 = fits_strcasecmp(urltype,"FILE://");
            if (iVar3 == 0) {
              __s = pFVar2->filename;
              sVar4 = strlen(__s);
              if (0x400 < sVar4) {
                ffpmsg("Name of old file is too long. (fits_already_open)");
                *status = 0x68;
                return 0x68;
              }
              strcpy(oldinfile,__s);
              iVar3 = standardize_path(oldinfile,status);
              if (iVar3 != 0) goto LAB_001128da;
              iVar3 = strcmp(tmpinfile,oldinfile);
              if (iVar3 == 0) {
                if (noextsyn == 0) {
                  if ((*rowfilter == '\0') && (*binspec == '\0')) {
                    if (*colspec == '\0') {
                      local_1cd4 = uVar7;
                    }
                    if (*colspec == '\0' && mode == 1) goto LAB_00112618;
                  }
                }
                else {
joined_r0x001127be:
                  local_1cd4 = uVar7;
                  if (mode == 1) {
LAB_00112618:
                    local_1cd4 = uVar7;
                    if (pFVar2->writemode == 0) {
                      ffpmsg("cannot reopen file READWRITE when previously opened READONLY");
                      ffpmsg(url);
                      *status = 0x68;
                      return 0x68;
                    }
                  }
                }
              }
            }
          }
        }
        ppFVar6 = ppFVar6 + 1;
      }
      if (-1 < (int)local_1cd4) {
        pFVar2 = FptrTable[local_1cd4];
        pfVar5 = (fitsfile *)calloc(1,0x10);
        *fptr = pfVar5;
        if (pfVar5 == (fitsfile *)0x0) {
          ffpmsg("failed to allocate structure for following file: (ffopen)");
          ffpmsg(url);
          *status = 0x71;
          return 0x71;
        }
        pfVar5->Fptr = pFVar2;
        piVar1 = &pFVar2->open_count;
        *piVar1 = *piVar1 + 1;
        if (*binspec != '\0') {
          *extspec = '\0';
        }
        *rowfilter = '\0';
        *binspec = '\0';
        *colspec = '\0';
        *isopen = 1;
      }
    }
  }
LAB_001128da:
  return *status;
}

Assistant:

int fits_already_open(fitsfile **fptr, /* I/O - FITS file pointer       */ 
           char *url, 
           char *urltype, 
           char *infile, 
           char *extspec, 
           char *rowfilter,
           char *binspec, 
           char *colspec, 
           int  mode,             /* I - 0 = open readonly; 1 = read/write   */
           int  noextsyn, /* I - 0 = ext syntax may be used; 1 = ext syntax disabled */
           int  *isopen,          /* O - 1 = file is already open            */
           int  *status)          /* IO - error status                       */
/*
  Check if the file to be opened is already open.  If so, then attach to it.
*/

   /* the input strings must not exceed the standard lengths */
   /* of FLEN_FILENAME, MAX_PREFIX_LEN, etc. */

     /*
       this function was changed so that for files of access method FILE://
       the file paths are compared using standard URL syntax and absolute
       paths (as opposed to relative paths). This eliminates some instances
       where a file is already opened but it is not realized because it
       was opened with another file path. For instance, if the CWD is
       /a/b/c and I open /a/b/c/foo.fits then open ./foo.fits the previous
       version of this function would not have reconized that the two files
       were the same. This version does recognize that the two files are
       the same.
     */
{
    FITSfile *oldFptr;
    int ii, iMatch=-1;
    char oldurltype[MAX_PREFIX_LEN], oldinfile[FLEN_FILENAME];
    char oldextspec[FLEN_FILENAME], oldoutfile[FLEN_FILENAME];
    char oldrowfilter[FLEN_FILENAME];
    char oldbinspec[FLEN_FILENAME], oldcolspec[FLEN_FILENAME];
    char cwd[FLEN_FILENAME];
    char tmpStr[FLEN_FILENAME];
    char tmpinfile[FLEN_FILENAME]; 
    
    *isopen = 0;

/*  When opening a file with readonly access then we simply let
    the operating system open the file again, instead of using the CFITSIO
    trick of attaching to the previously opened file.  This is required
    if CFITSIO is running in a multi-threaded environment, because 2 different
    threads cannot share the same FITSfile pointer.
    
    If the file is opened/reopened with write access, then the file MUST
    only be physically opened once..
*/ 
    if (mode == 0)
        return(*status);

    strcpy(tmpinfile, infile);
    if(fits_strcasecmp(urltype,"FILE://") == 0)
    {
       if (standardize_path(tmpinfile, status))
          return(*status);          
    }

    for (ii = 0; ii < NMAXFILES; ii++)   /* check every buffer */
    {
        if (FptrTable[ii] != 0)
        {
          oldFptr = FptrTable[ii];
          
          if (oldFptr->noextsyntax)
          {
            /* old urltype must be "file://" */
            if (fits_strcasecmp(urltype,"FILE://") == 0)
            {
               /* compare tmpinfile to adjusted oldFptr->filename */
               
               /* This shouldn't be possible, but check anyway */
               if (strlen(oldFptr->filename) > FLEN_FILENAME-1)        
               {
                  ffpmsg("Name of old file is too long. (fits_already_open)");
                  return (*status = FILE_NOT_OPENED);
               }
               strcpy(oldinfile, oldFptr->filename);
               if (standardize_path(oldinfile, status))
                  return(*status);
                              
               if (!strcmp(tmpinfile, oldinfile))
               {
                  /* if infile is not noextsyn, must check that it is not
                     using filters of any kind */
                  if (noextsyn || (!rowfilter[0] && !binspec[0] && !colspec[0])) 
                  {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;
                  }  
               }
             }            
          } /* end if old file has disabled extended syntax */
          else
          {
             fits_parse_input_url(oldFptr->filename, oldurltype, 
                       oldinfile, oldoutfile, oldextspec, oldrowfilter, 
                       oldbinspec, oldcolspec, status);

             if (*status > 0)
             {
               ffpmsg("could not parse the previously opened filename: (ffopen)");
               ffpmsg(oldFptr->filename);
               return(*status);
             }
             
             if(fits_strcasecmp(oldurltype,"FILE://") == 0)
               {
                 if (standardize_path(oldinfile, status))
                    return(*status);
               }

             if (!strcmp(urltype, oldurltype) && !strcmp(tmpinfile, oldinfile) )
             {
                 /* identical type of file and root file name */

                 if ( (!rowfilter[0] && !oldrowfilter[0] &&
                       !binspec[0]   && !oldbinspec[0] &&
                       !colspec[0]   && !oldcolspec[0])

                     /* no filtering or binning specs for either file, so */
                     /* this is a case where the same file is being reopened. */
                     /* It doesn't matter if the extensions are different */

                         ||   /* or */

                     (!strcmp(rowfilter, oldrowfilter) &&
                      !strcmp(binspec, oldbinspec)     &&
                      !strcmp(colspec, oldcolspec)     &&
                      !strcmp(extspec, oldextspec) ) )

                     /* filtering specs are given and are identical, and */
                     /* the same extension is specified */

                 {
                     if (mode == READWRITE && oldFptr->writemode == READONLY)
                     {
                       /*
                         cannot assume that a file previously opened with READONLY
                         can now be written to (e.g., files on CDROM, or over the
                         the network, or STDIN), so return with an error.
                       */

                       ffpmsg(
                   "cannot reopen file READWRITE when previously opened READONLY");
                       ffpmsg(url);
                       return(*status = FILE_NOT_OPENED);
                     }
                     iMatch = ii;

                  }
              }
          } /* end if old file recognizes extended syntax */
      } /* end if old fptr exists */
    } /* end loop over NMAXFILES */
    if (iMatch >= 0)
    {
       oldFptr = FptrTable[iMatch];
       *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

       if (!(*fptr))
       {
          ffpmsg(
        "failed to allocate structure for following file: (ffopen)");
          ffpmsg(url);
          return(*status = MEMORY_ALLOCATION);
       }

       (*fptr)->Fptr = oldFptr; /* point to the structure */
       (*fptr)->HDUposition = 0;     /* set initial position */
       (((*fptr)->Fptr)->open_count)++;  /* increment usage counter */

       if (binspec[0])  /* if binning specified, don't move */
           extspec[0] = '\0';

       /* all the filtering has already been applied, so ignore */
       rowfilter[0] = '\0';
       binspec[0] = '\0';
       colspec[0] = '\0';

       *isopen = 1;
    }
    return(*status);
}